

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::RegisterTraceWriterResponse>::Deferred
          (Deferred<perfetto::protos::gen::RegisterTraceWriterResponse> *this,
          function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::RegisterTraceWriterResponse>)>
          *callback)

{
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  (this->super_DeferredBase).callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_DeferredBase).callback_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_DeferredBase).callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_DeferredBase).callback_.super__Function_base._M_functor + 8) =
       0;
  p_Var1 = (callback->super__Function_base)._M_manager;
  local_20 = callback->_M_invoker;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  Bind(this,(function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::RegisterTraceWriterResponse>)>
             *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  return;
}

Assistant:

explicit Deferred(std::function<void(AsyncResult<T>)> callback = nullptr) {
    Bind(std::move(callback));
  }